

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>
              *this,int i)

{
  double *pdVar1;
  int i_1;
  ulong uVar2;
  value_type vVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_e0;
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  local_d0;
  value_type local_c0;
  value_type local_a0;
  value_type local_80;
  value_type local_60;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx(&local_60,&this->left_->fadexpr_,i)
  ;
  FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_80,&this->right_->fadexpr_);
  local_e0.fadexpr_.left_ = &local_60;
  local_e0.fadexpr_.right_ = &local_80;
  FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::fastAccessDx(&local_a0,&this->right_->fadexpr_,i);
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_c0,&this->left_->fadexpr_);
  local_d0.right_ = &local_40;
  local_d0.left_ = &local_e0;
  if (local_80.dx_.num_elts < local_60.dx_.num_elts) {
    local_80.dx_.num_elts = local_60.dx_.num_elts;
  }
  if (local_c0.dx_.num_elts < local_a0.dx_.num_elts) {
    local_c0.dx_.num_elts = local_a0.dx_.num_elts;
  }
  if (local_c0.dx_.num_elts < local_80.dx_.num_elts) {
    local_c0.dx_.num_elts = local_80.dx_.num_elts;
  }
  __return_storage_ptr__->val_ = local_a0.val_ * local_c0.val_ + local_60.val_ * local_80.val_;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  local_40.fadexpr_.left_ = &local_a0;
  local_40.fadexpr_.right_ = &local_c0;
  if (local_c0.dx_.num_elts < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = local_c0.dx_.num_elts;
    pdVar1 = (double *)operator_new__((ulong)(uint)local_c0.dx_.num_elts * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar1;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar2 = 0;
    do {
      vVar3 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::dx(&local_d0,(int)uVar2);
      pdVar1[uVar2] = vVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)local_c0.dx_.num_elts != uVar2);
  }
  Fad<double>::~Fad(&local_c0);
  Fad<double>::~Fad(&local_a0);
  Fad<double>::~Fad(&local_80);
  Fad<double>::~Fad(&local_60);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}